

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O3

BOOL SetEnvironmentVariableW(LPCWSTR lpName,LPCWSTR lpValue)

{
  int iVar1;
  BOOL BVar2;
  LPCSTR lpMultiByteStr;
  LPSTR lpMultiByteStr_00;
  DWORD DVar3;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00132f9c;
  iVar1 = WideCharToMultiByte(0,0,lpName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132f9c;
    DVar3 = 0x57;
LAB_00132ece:
    SetLastError(DVar3);
    lpMultiByteStr = (LPCSTR)0x0;
LAB_00132ed5:
    lpMultiByteStr_00 = (LPSTR)0x0;
    BVar2 = 0;
  }
  else {
    lpMultiByteStr = (LPCSTR)PAL_malloc((long)iVar1);
    if (lpMultiByteStr == (LPCSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132f9c;
      DVar3 = 8;
      goto LAB_00132ece;
    }
    BVar2 = 0;
    iVar1 = WideCharToMultiByte(0,0,lpName,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar1 != 0) {
      if (lpValue == (LPCWSTR)0x0) {
        lpMultiByteStr_00 = (LPCSTR)0x0;
LAB_00132f2c:
        BVar2 = SetEnvironmentVariableA(lpMultiByteStr,lpMultiByteStr_00);
        goto LAB_00132f41;
      }
      iVar1 = WideCharToMultiByte(0,0,lpValue,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar1 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132f9c;
        DVar3 = 0x57;
      }
      else {
        lpMultiByteStr_00 = (LPSTR)PAL_malloc((long)iVar1);
        if (lpMultiByteStr_00 != (LPSTR)0x0) {
          BVar2 = 0;
          iVar1 = WideCharToMultiByte(0,0,lpValue,-1,lpMultiByteStr_00,iVar1,(LPCSTR)0x0,(LPBOOL)0x0
                                     );
          if (iVar1 == 0) {
            fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                    ,0x13e);
            fprintf(_stderr,"WideCharToMultiByte failed\n");
            SetLastError(0x54f);
            goto LAB_00132f41;
          }
          goto LAB_00132f2c;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132f9c;
        DVar3 = 8;
      }
      SetLastError(DVar3);
      goto LAB_00132ed5;
    }
    fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
            ,0x123);
    fprintf(_stderr,"WideCharToMultiByte returned 0\n");
    SetLastError(0x54f);
    lpMultiByteStr_00 = (LPSTR)0x0;
  }
LAB_00132f41:
  PAL_free(lpMultiByteStr_00);
  PAL_free(lpMultiByteStr);
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar2;
  }
LAB_00132f9c:
  abort();
}

Assistant:

BOOL
PALAPI
SetEnvironmentVariableW(
            IN LPCWSTR lpName,
            IN LPCWSTR lpValue)
{
    PCHAR name = NULL;
    PCHAR value = NULL;
    INT nameSize = 0;
    INT valueSize = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(SetEnvironmentVariableW);
    ENTRY("SetEnvironmentVariableW(lpName=%p (%S), lpValue=%p (%S))\n",
        lpName?lpName:W16_NULLSTRING,
        lpName?lpName:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING);

    if ((nameSize = WideCharToMultiByte(CP_ACP, 0, lpName, -1, name, 0, 
                                        NULL, NULL)) == 0)
    {
        ERROR("WideCharToMultiByte failed\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    name = (PCHAR)PAL_malloc(sizeof(CHAR)* nameSize);
    if (name == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    
    if ( 0 == WideCharToMultiByte(CP_ACP, 0, lpName,  -1, 
                                  name,  nameSize, NULL, NULL ) )
    {
        ASSERT( "WideCharToMultiByte returned 0\n" );
        SetLastError( ERROR_INTERNAL_ERROR );
        goto done;
    }

    if ( NULL != lpValue )
    {
        if ((valueSize = WideCharToMultiByte(CP_ACP, 0, lpValue, -1, value, 
                                             0, NULL, NULL)) == 0)
        {
            ERROR("WideCharToMultiByte failed\n");
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        value = (PCHAR)PAL_malloc(sizeof(CHAR)*valueSize);
        
        if ( NULL == value )
        {
            ERROR("malloc failed\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        
        if ( 0 == WideCharToMultiByte( CP_ACP, 0, lpValue, -1, 
                                       value, valueSize, NULL, NULL ) )
        {
            ASSERT("WideCharToMultiByte failed\n");
            SetLastError( ERROR_INTERNAL_ERROR );
            goto done;
        }
    }
    

    bRet = SetEnvironmentVariableA(name, value);
done:
    PAL_free(value);
    PAL_free(name);
    
    LOGEXIT("SetEnvironmentVariableW returning BOOL %d\n", bRet);
    PERF_EXIT(SetEnvironmentVariableW);
    return bRet;
}